

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian-branching.hxx
# Opt level: O1

double __thiscall
lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>::
optimizeStep(HungarianBranching<lineage::heuristics::PartitionGraph> *this,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *first,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *second,bool mark_solution)

{
  PartitionGraph *this_00;
  pointer pAVar1;
  pointer puVar2;
  unsigned_long uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  pointer pVVar7;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var8;
  pointer puVar9;
  pointer pIVar10;
  runtime_error *prVar11;
  pointer pAVar12;
  ulong uVar13;
  Value edge;
  difference_type __d_1;
  ulong uVar14;
  ulong uVar15;
  size_t row;
  long lVar16;
  ulong *puVar17;
  size_t sVar18;
  bool bVar19;
  double dVar20;
  vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
  matches;
  cost_t original_costs;
  anon_class_24_3_d1c0cc24 setCost;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  matcher;
  bipartite_graph_t bigraph;
  mask_t local_1d8;
  cost_t local_1b8;
  vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
  local_198;
  long local_180;
  size_t local_178;
  size_t local_170;
  size_t local_168;
  double local_160;
  vector<double,_std::allocator<double>_> local_158;
  anon_class_24_3_d1c0cc24 local_140;
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  local_128;
  bipartite_graph_t local_68;
  
  lVar4 = (long)(first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
  lVar5 = lVar4 >> 2;
  lVar16 = (long)(second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  lVar6 = lVar5 + lVar16;
  std::
  vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ::vector(&local_68.vertices_,lVar6 * 2,(allocator_type *)&local_128);
  local_68.edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_68.edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_68.edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_68.edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_68.multipleEdgesEnabled_ = false;
  local_140.costs = &local_1b8;
  local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_140.mask = &local_1d8;
  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  puVar9 = (first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_140.bigraph = &local_68;
  if ((first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar9) {
    local_180 = lVar16 + lVar6;
    row = 0;
    do {
      lVar16 = local_180;
      sVar18 = row + local_180;
      dVar20 = PartitionGraph::terminationCosts
                         ((this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).
                          graph_,puVar9[row]);
      local_170 = sVar18;
      optimizeStep::anon_class_24_3_d1c0cc24::operator()(&local_140,row,sVar18,dVar20);
      local_168 = row + (lVar4 >> 3);
      local_178 = local_168 + lVar16;
      optimizeStep::anon_class_24_3_d1c0cc24::operator()(&local_140,local_168,local_178,0.0);
      pVVar7 = (((this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_)->
               super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
               super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar16 = puVar9[row] * 0x40;
      for (puVar17 = *(ulong **)&((Adjacencies *)((long)(pVVar7 + puVar9[row]) + 0x20))->vector_;
          puVar17 != *(ulong **)((long)&pVVar7->to_ + lVar16 + 8U); puVar17 = puVar17 + 2) {
        local_128.graph_ = (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)*puVar17;
        _Var8 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                          ((second->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start,
                           (second->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish,&local_128);
        if (_Var8._M_current !=
            (second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          this_00 = (this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_;
          pVVar7 = (this_00->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                   vertices_.
                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pAVar12 = *(pointer *)&((Adjacencies *)((long)(pVVar7 + puVar9[row]) + 0x20))->vector_;
          pAVar1 = *(pointer *)((long)(pVVar7 + puVar9[row]) + 0x28);
          uVar13 = (long)pAVar1 - (long)pAVar12 >> 4;
          while (uVar14 = uVar13, 0 < (long)uVar14) {
            uVar13 = uVar14 >> 1;
            if (*(Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> **)(pAVar12 + uVar13) <
                local_128.graph_) {
              pAVar12 = pAVar12 + uVar13 + 1;
              uVar13 = ~uVar13 + uVar14;
            }
          }
          if ((pAVar1 == pAVar12) ||
             ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)pAVar12->vertex_ !=
              local_128.graph_)) {
            bVar19 = false;
            edge = 0;
          }
          else {
            edge = pAVar12->edge_;
            bVar19 = true;
          }
          if (!bVar19) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar11,"Could not find edge (A, B)!");
            __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          puVar2 = (second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          local_160 = PartitionGraph::costOfEdge(this_00,edge);
          lVar16 = (long)_Var8._M_current - (long)puVar2 >> 3;
          sVar18 = lVar16 + lVar6;
          optimizeStep::anon_class_24_3_d1c0cc24::operator()(&local_140,row,sVar18,local_160);
          optimizeStep::anon_class_24_3_d1c0cc24::operator()(&local_140,local_168,sVar18,local_160);
          sVar18 = lVar16 + lVar5;
          optimizeStep::anon_class_24_3_d1c0cc24::operator()(&local_140,sVar18,local_170,0.0);
          optimizeStep::anon_class_24_3_d1c0cc24::operator()(&local_140,sVar18,local_178,0.0);
        }
        pVVar7 = (((this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_)->
                 super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar16 = puVar9[row] << 6;
      }
      row = row + 1;
      puVar9 = (first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (row < (ulong)((long)(first->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 3));
  }
  puVar9 = (second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar9) {
    uVar13 = 0;
    do {
      dVar20 = PartitionGraph::birthCosts
                         ((this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).
                          graph_,puVar9[uVar13]);
      optimizeStep::anon_class_24_3_d1c0cc24::operator()
                (&local_140,lVar5 + uVar13,lVar6 + uVar13,dVar20);
      uVar13 = uVar13 + 1;
      puVar9 = (second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(second->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 3)
            );
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_158,&local_1b8);
  markurem::matching::
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  ::Matching(&local_128,&local_68,&local_1b8,&local_1d8);
  markurem::matching::
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  ::run(&local_128);
  markurem::matching::
  Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
  ::matches(&local_198,&local_128);
  if ((long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == 0) {
    dVar20 = 0.0;
  }
  else {
    lVar4 = (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    dVar20 = 0.0;
    lVar5 = 0;
    do {
      if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar5] == 1) {
        dVar20 = dVar20 + local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar5];
      }
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  pIVar10 = local_198.
            super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (mark_solution) {
    for (; pIVar10 !=
           local_198.
           super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
           ._M_impl.super__Vector_impl_data._M_finish; pIVar10 = pIVar10 + 1) {
      puVar9 = (second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pIVar10->col <
          (ulong)(((long)(second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 3) + lVar6)) {
        uVar13 = puVar9[pIVar10->col - lVar6];
        uVar14 = pIVar10->row;
        puVar9 = (first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar4 = (long)(first->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar9;
        uVar15 = lVar4 >> 3;
        if ((uVar14 < uVar15) ||
           (bVar19 = uVar14 < (ulong)(lVar4 >> 2), uVar14 = uVar14 - uVar15, bVar19)) {
          uVar3 = puVar9[uVar14];
          pVVar7 = (((this->super_BranchingOptimizer<lineage::heuristics::PartitionGraph>).graph_)->
                   super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pAVar12 = *(pointer *)&((Adjacencies *)((long)(pVVar7 + uVar3) + 0x20))->vector_;
          pAVar1 = *(pointer *)((long)(pVVar7 + uVar3) + 0x28);
          uVar14 = (long)pAVar1 - (long)pAVar12 >> 4;
          while (uVar15 = uVar14, 0 < (long)uVar15) {
            uVar14 = uVar15 >> 1;
            if (pAVar12[uVar14].vertex_ < uVar13) {
              pAVar12 = pAVar12 + uVar14 + 1;
              uVar14 = ~uVar14 + uVar15;
            }
          }
          if ((pAVar1 == pAVar12) || (pAVar12->vertex_ != uVar13)) {
            bVar19 = false;
            uVar13 = 0;
          }
          else {
            uVar13 = pAVar12->edge_;
            bVar19 = true;
          }
          if (!bVar19) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar11,"Could not find matched edge!");
            __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          (this->solution_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar13] = '\x01';
        }
      }
    }
  }
  if (local_198.
      super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.
                    super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_128.path_.
      super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.path_.
                    super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.path_.
                          super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.path_.
                          super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_128.col_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_128.col_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_128.col_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_128.col_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_128.col_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_128.col_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_128.col_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_128.col_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    local_128.col_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_128.row_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_128.row_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_128.row_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_128.row_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_128.row_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_128.row_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_128.row_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_128.row_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    local_128.row_cover.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_128.cols_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.cols_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.cols_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.cols_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_128.rows_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.rows_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.rows_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.rows_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.edges_.
      super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.edges_.
                    super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT71(local_68.edges_.
                             super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_68.edges_.
                             super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                    (long)local_68.edges_.
                          super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ::~vector(&local_68.vertices_);
  return dVar20;
}

Assistant:

inline double
HungarianBranching<GRAPH>::optimizeStep(std::vector<size_t> const& first,
                                        std::vector<size_t> const& second,
                                        bool mark_solution)
{
    // setup cost for matching.
    const size_t n_rows = 2 * first.size() + second.size();
    const size_t n_cols = n_rows;

    // lookup for auxiliary nodes.
    const size_t first_size = first.size();
    const size_t second_size = second.size();
    auto idxOfRow = [=](size_t row) { return row; };
    auto idxOfDuplicateRow = [=](size_t row) { return first_size + row; };
    auto idxOfBirthRow = [=](size_t col) { return 2 * first_size + col; };
    auto idxOfCol = [=](size_t col) { return n_rows + col; };
    auto idxOfTerminationCol = [=](size_t row) {
        return n_rows + second_size + row;
    };

    // construct auxiliary graph for matching.
    auto bigraph = bipartite_graph_t(n_rows + n_cols);
    auto costs = cost_t();
    auto mask = mask_t();

    auto setCost = [&](size_t row, size_t col, double val) {
        bigraph.insertEdge(row, col);
        costs.emplace_back(val);
        mask.emplace_back(0);
    };

    for (size_t row = 0; row < first.size(); ++row) {

        auto const& partitionIdA = first[row];

        // termination costs.

        setCost(idxOfRow(row), idxOfTerminationCol(row),
                this->graph_.terminationCosts(partitionIdA));
        setCost(idxOfDuplicateRow(row),
                idxOfTerminationCol(idxOfDuplicateRow(row)), .0);

        for (auto it = this->graph_.verticesFromVertexBegin(partitionIdA);
             it != this->graph_.verticesFromVertexEnd(partitionIdA); ++it) {
            auto const& partitionIdB = *it;

            const auto pos =
                std::find(second.cbegin(), second.cend(), partitionIdB);
            if (pos == second.cend()) { // if maxDistance is limited, then it
                                        // might be that the edge is not found.
                continue;
                // throw std::runtime_error(
                //        "Could not find neighbouring partition in frame
                //        t+1!");
            }
            const auto col = std::distance(second.cbegin(), pos);

            const auto p = this->graph_.findEdge(partitionIdA, partitionIdB);
            if (!p.first)
                throw std::runtime_error("Could not find edge (A, B)!");

            auto const& coeff = this->graph_.costOfEdge(p.second);

            setCost(idxOfRow(row), idxOfCol(col), coeff);
            setCost(idxOfDuplicateRow(row), idxOfCol(col), coeff);

            // auxiliary edges.
            setCost(idxOfBirthRow(col), idxOfTerminationCol(row), .0);
            setCost(idxOfBirthRow(col),
                    idxOfTerminationCol(idxOfDuplicateRow(row)), .0);
        }
    }

    // birth costs.
    for (size_t col = 0; col < second.size(); ++col) {
        auto const& partitionIdB = second[col];
        setCost(idxOfBirthRow(col), idxOfCol(col),
                this->graph_.birthCosts(partitionIdB));
    }

    // Matching modifies the costs of the given vector, so we make a copy for
    // objective calculation later on.
    auto const original_costs = costs;

    auto matcher =
        markurem::matching::Matching<bipartite_graph_t, cost_t, mask_t>(
            bigraph, costs, mask);
    matcher.run();

    // calculate objective and mark edges.
    double objective = .0;
    auto const matches = matcher.matches();

    for (size_t idx = 0; idx < mask.size(); ++idx)
        if (mask[idx] == 1)
            objective += original_costs[idx];

    if (mark_solution) {
        for (auto const& match : matches) {
            // if the match involves to original nodes, then
            // mark the edge as matched in the solution.
            size_t partitionIdA, partitionIdB;
            if (match.col >= second.size() + n_rows)
                continue;
            else
                partitionIdB = second[match.col - n_rows];

            if (match.row < first.size())
                partitionIdA = first[match.row];
            else if (match.row < 2 * first.size())
                partitionIdA = first[match.row - first.size()];
            else
                continue;

            auto p = this->graph_.findEdge(partitionIdA, partitionIdB);
            if (!p.first)
                throw std::runtime_error("Could not find matched edge!");

            solution_[p.second] = true;
        }
    }

    return objective;
}